

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O0

void FastPForLib::__pack<1u,true>(uint32_t *in,uint32_t *out)

{
  bool bVar1;
  uint32_t uVar2;
  uint *in_RSI;
  uint32_t *in_RDI;
  uint32_t i;
  uint32_t k;
  uint32_t inwordpointer;
  uint local_1c;
  uint local_14;
  uint *local_10;
  uint32_t *local_8;
  
  local_14 = 0;
  bVar1 = false;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (!bVar1) {
    if (local_14 == 0) {
      uVar2 = __bitmask<1u,true>(*local_8);
      *local_10 = uVar2;
      local_14 = 1;
      local_8 = local_8 + 1;
    }
    local_1c = 0;
    for (; (local_1c < 0x21 && (local_14 < 0x20)); local_14 = local_14 + 1) {
      uVar2 = __bitmask<1u,true>(*local_8);
      *local_10 = uVar2 << ((byte)local_14 & 0x1f) | *local_10;
      local_1c = local_1c + 1;
      local_8 = local_8 + 1;
    }
    if (local_14 < 0x20) {
      uVar2 = __bitmask<1u,true>(*local_8);
      *local_10 = uVar2 << ((byte)local_14 & 0x1f) | *local_10;
      local_14 = local_14 - 0x1f;
      uVar2 = __bitmask<1u,true>(*local_8);
      local_10[1] = uVar2 >> (1U - (char)local_14 & 0x1f);
      local_8 = local_8 + 1;
    }
    else {
      local_14 = 0;
    }
    local_10 = local_10 + 1;
    bVar1 = true;
  }
  return;
}

Assistant:

void __pack(const uint32_t *__restrict__ in, uint32_t *__restrict__ out) {
  uint32_t inwordpointer = 0; // indicates where we are reading
  // k iterates over the output
  for (uint32_t k = 0; k < bit; ++k, ++out) {
    if (inwordpointer == 0) {
      *out = __bitmask<bit, mask>(*in++);
      inwordpointer += bit;
    }
    // compiler (gcc 4.6.3) had trouble with this, cannot unroll
    // while(inwordpointer <= 32-bit) {
    //    *out |= __bitmask<bit, mask> (*in++) << inwordpointer;
    //    inwordpointer += bit;
    //}
    // attempt (grungy!)

    // loop cannot iterate much
    for (uint32_t i = 0; i < 1 + 32 / bit; ++i) {
      if (inwordpointer > 32 - bit)
        break;
      *out |= __bitmask<bit, mask>(*in++) << inwordpointer;
      inwordpointer += bit;
    }
    // end ofk grunge

    if (inwordpointer < 32) {
      *out |= __bitmask<bit, mask>(*in) << inwordpointer;
      inwordpointer += bit - 32;
      *(out + 1) = __bitmask<bit, mask>(*in++) >> (bit - inwordpointer);

    } else
      // inwordpointer==32
      inwordpointer = 0;
  }
}